

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.hpp
# Opt level: O1

int cpprofiler::sendall(int s,char *buf,int *len)

{
  ssize_t in_RAX;
  int iVar1;
  int iVar2;
  
  iVar1 = *len;
  if (iVar1 < 1) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    do {
      in_RAX = send(s,buf + iVar2,(long)iVar1,0);
      if (in_RAX == -1) break;
      iVar2 = iVar2 + (int)in_RAX;
      iVar1 = iVar1 - (int)in_RAX;
    } while (iVar2 < *len);
  }
  *len = iVar2;
  return (int)in_RAX;
}

Assistant:

static int sendall(int s, const char* buf, int* len) {
  int total = 0;         // how many bytes we've sent
  int bytesleft = *len;  // how many we have left to send
  ssize_t n;

  while (total < *len) {
    n = send(s, buf + total, static_cast<size_t>(bytesleft), 0);
    if (n == -1) {
      break;
    }
    total += static_cast<int>(n);
    bytesleft -= static_cast<int>(n);
  }

  *len = total;  // return number actually sent here

  return n == -1 ? -1 : 0;  // return -1 on failure, 0 on success
}